

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void drawText(undefined8 *windows,int param_2)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  char new [25];
  
  pcVar4 = new;
  builtin_strncpy(new + 0x10,"ame text",9);
  builtin_strncpy(new,"Placeholder newg",0x10);
  if (param_2 < 0x65) {
    pcVar4 = &stack0x00000008;
    if (param_2 != 99) {
      if (param_2 != 100) goto LAB_00104069;
      pcVar4 = &stack0x000001fc;
    }
  }
  else {
    if (param_2 != 0x65) {
      if (param_2 == 0x6e) {
        uVar5 = 1;
        goto LAB_00104087;
      }
LAB_00104069:
      quit("Simulation terminated with unknown condition");
      uVar5 = 0;
      pcVar4 = (undefined1 *)0x0;
      goto LAB_00104087;
    }
    pcVar4 = &stack0x000003f0;
  }
  uVar5 = 0;
LAB_00104087:
  wclear(*windows);
  wborder(*windows,0,0,0,0,0);
  iVar2 = wmove(*windows,2,4);
  if (iVar2 != -1) {
    waddnstr(*windows,"Level x: Title",0xffffffff);
  }
  iVar2 = wmove(*windows,2,0x31);
  if (iVar2 != -1) {
    waddnstr(*windows,"Press any key to continue...",0xffffffff);
  }
  wrefresh(*windows);
  lVar3 = 1;
  while (pcVar1 = pcVar4 + lVar3, *pcVar1 != '\0') {
    lVar3 = lVar3 + 1;
    if (*pcVar1 == '\n') {
      uVar5 = uVar5 + 1;
    }
  }
  if (0x18 < uVar5) {
    quit("Too much text in current dialogue entry");
  }
  wresize(*windows,uVar5,0x49);
  mvwin(*windows,0xc - (uVar5 >> 1),4);
  wclear(*windows);
  iVar2 = wmove(*windows,0,0);
  if (iVar2 != -1) {
    waddnstr(*windows,pcVar4,0xffffffff);
  }
  wrefresh(*windows);
  getchar();
  wresize(*windows,0x18,0x50);
  mvwin(*windows,0,0);
  return;
}

Assistant:

void drawText(struct Windows *windows, struct Dialog dialog,
    enum GameMode gameMode) {
    char *target = NULL;
    char current;
    char new[] = "Placeholder newgame text"; //TODO revise
    int height = 0;
    int i = 1;
    int yOff, xOff;

    /* Get dialogue text field */
    switch (gameMode) {
        case NEW:
            target = new;
            height=1;
            break;
        case CONTINUE:
            target = dialog.textIntro;
            break;
        case WIN:
            target = dialog.textWin;
            break;
        case LOSE:
            target = dialog.textLose;
            break;
        default:
            quit("Simulation terminated with unknown condition");
    }

    xOff = MAX_COLS / 2 - MAP_COLS / 2;

    /* Print borders and static text */
    wclear(windows->menu);
    box(windows->menu, 0, 0);
    mvwaddstr(windows->menu,2,xOff,"Level x: Title"); //TODO revise
    mvwaddstr(windows->menu,2,MAX_COLS-27-xOff,"Press any key to continue...");


    wrefresh(windows->menu);

    /* Determine text height based on newline count */
    while ((current = target[i++]) != '\0')
        if (current == '\n')height++;
    if (height > MAX_ROWS) quit("Too much text in current dialogue entry");

    yOff = MAX_ROWS / 2 - height / 2;

    /* Resize window (temporarily)*/
    wresize(windows->menu, height, MAP_COLS + 1); // +1 for newline
    mvwin(windows->menu, yOff, xOff);
    wclear(windows->menu);


    /* Printout to screen */
    mvwaddstr(windows->menu,0,0, target);
    wrefresh(windows->menu);

    /* Wait for user input to continue */
    getchar();

    /* Restore window dimensions */
    wresize(windows->menu, MAX_ROWS, MAX_COLS);
    mvwin(windows->menu, 0, 0);
}